

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O0

size_t byte_encode(uint8_t *obuff,size_t osize,uint64_t v,uint64_t max)

{
  int op;
  uint64_t max_local;
  uint64_t v_local;
  size_t osize_local;
  uint8_t *obuff_local;
  
  op = 0;
  v_local = v - 1;
  for (max_local = max - 1; max_local != 0; max_local = max_local >> 8) {
    obuff[op] = (uint8_t)v_local;
    v_local = v_local >> 8;
    op = op + 1;
  }
  return (long)op;
}

Assistant:

size_t byte_encode(uint8_t* obuff, size_t osize, uint64_t v, uint64_t max)
{
    int op = 0;
    max--; /* working here with zero-origin values */
    v--;
    while (max) {
        // myassert(op < osize);
        obuff[op++] = v & 255;
        v >>= 8;
        max >>= 8;
    }
    return op;
}